

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCommonBugsTests.cpp
# Opt level: O2

IterateResult __thiscall
gl3cts::InputVariablesCannotBeModifiedTest::iterate(InputVariablesCannotBeModifiedTest *this)

{
  ostringstream *this_00;
  _shader_stage stage;
  bool bVar1;
  bool bVar2;
  ContextType ctxType;
  int iVar3;
  GLuint GVar4;
  uint err;
  deUint32 dVar5;
  undefined4 extraout_var;
  GLuint *pGVar7;
  TestError *this_01;
  char *pcVar8;
  InputVariablesCannotBeModifiedTest *pIVar9;
  _test_iteration iteration;
  ApiType current_iteration_min_context_type;
  GLint compile_status;
  _shader_stage current_iteration_shader_stage;
  char *current_iteration_body_raw_ptr;
  GLuint *local_640;
  GLuint *local_638;
  GLuint *local_630;
  GLuint *local_628;
  GLuint *local_620;
  string current_iteration_body;
  string local_5f8;
  string local_5d8;
  undefined1 local_5b8 [384];
  char temp [1024];
  long lVar6;
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x123);
  if (bVar1) {
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8dd9);
    this->m_gs_id = GVar4;
  }
  bVar1 = glu::contextSupports(ctxType,(ApiType)0x104);
  if (bVar1) {
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8e88);
    this->m_tc_id = GVar4;
    GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8e87);
    this->m_te_id = GVar4;
  }
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
  local_620 = &this->m_fs_id;
  this->m_fs_id = GVar4;
  GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
  local_628 = &this->m_vs_id;
  this->m_vs_id = GVar4;
  err = (**(code **)(lVar6 + 0x800))();
  pIVar9 = (InputVariablesCannotBeModifiedTest *)(ulong)err;
  glu::checkError(err,"glCreateShader() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                  ,0x380);
  local_630 = &this->m_te_id;
  local_638 = &this->m_tc_id;
  local_640 = &this->m_gs_id;
  bVar1 = true;
  this_00 = (ostringstream *)(local_5b8 + 8);
  for (iteration = TEST_ITERATION_FIRST; iteration != TEST_ITERATION_COUNT;
      iteration = iteration + TEST_ITERATION_INPUT_FS_VARIABLE_IN_INPUT_BLOCK) {
    compile_status = 0;
    current_iteration_body._M_dataplus._M_p = (pointer)&current_iteration_body.field_2;
    current_iteration_body._M_string_length = 0;
    current_iteration_body.field_2._M_local_buf[0] = '\0';
    current_iteration_body_raw_ptr = (char *)0x0;
    current_iteration_min_context_type.m_bits = 0x300;
    getIterationData(pIVar9,iteration,&current_iteration_min_context_type,
                     &current_iteration_shader_stage,&current_iteration_body);
    current_iteration_body_raw_ptr = current_iteration_body._M_dataplus._M_p;
    bVar2 = glu::contextSupports(ctxType,current_iteration_min_context_type);
    stage = current_iteration_shader_stage;
    if (bVar2) {
      pGVar7 = local_620;
      switch(current_iteration_shader_stage) {
      case SHADER_STAGE_FRAGMENT:
        break;
      case SHADER_STAGE_GEOMETRY:
        pGVar7 = local_640;
        break;
      case SHADER_STAGE_TESSELLATION_CONTROL:
        pGVar7 = local_638;
        break;
      case SHADER_STAGE_TESSELLATION_EVALUATION:
        pGVar7 = local_630;
        break;
      case SHADER_STAGE_VERTEX:
        pGVar7 = local_628;
        break;
      default:
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Unrecognized shader stage type",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                   ,0x3ad);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      GVar4 = *pGVar7;
      (**(code **)(lVar6 + 0x12b8))(GVar4,1,&current_iteration_body_raw_ptr,0);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glShaderSource() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3b6);
      (**(code **)(lVar6 + 0x248))(GVar4);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glCompileShader() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3ba);
      (**(code **)(lVar6 + 0xa70))(GVar4,0x8b81,&compile_status);
      dVar5 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar5,"glGetShaderiv() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCommonBugsTests.cpp"
                      ,0x3bd);
      (**(code **)(lVar6 + 0xa58))(GVar4,0x400,0,temp);
      if (compile_status == 1) {
        local_5b8._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream(this_00);
        pcVar8 = "The following ";
        std::operator<<((ostream *)this_00,"The following ");
        getShaderStageName_abi_cxx11_(&local_5d8,(InputVariablesCannotBeModifiedTest *)pcVar8,stage)
        ;
        std::operator<<((ostream *)this_00,(string *)&local_5d8);
        pIVar9 = (InputVariablesCannotBeModifiedTest *)0x1704c11;
        std::operator<<((ostream *)this_00," shader, used for test iteration [");
        getIterationName_abi_cxx11_(&local_5f8,pIVar9,iteration);
        std::operator<<((ostream *)this_00,(string *)&local_5f8);
        std::operator<<((ostream *)this_00,
                        "] was compiled successfully, even though it is invalid. Body:\n>>\n");
        std::operator<<((ostream *)this_00,(string *)&current_iteration_body);
        std::operator<<((ostream *)this_00,"\n<<\n");
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_5b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::string::~string((string *)&local_5f8);
        std::__cxx11::string::~string((string *)&local_5d8);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        bVar1 = false;
      }
    }
    pIVar9 = (InputVariablesCannotBeModifiedTest *)&current_iteration_body;
    std::__cxx11::string::~string((string *)&current_iteration_body);
  }
  pcVar8 = "Fail";
  if (bVar1) {
    pcVar8 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar1,
             pcVar8);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult InputVariablesCannotBeModifiedTest::iterate()
{
	const glu::ContextType context_type = m_context.getRenderContext().getType();
	const glw::Functions&  gl			= m_context.getRenderContext().getFunctions();
	bool				   result		= true;

	/* Create shader objects */
	if (glu::contextSupports(context_type, glu::ApiType::core(3, 2)))
	{
		m_gs_id = gl.createShader(GL_GEOMETRY_SHADER);
	}

	if (glu::contextSupports(context_type, glu::ApiType::core(4, 0)))
	{
		m_tc_id = gl.createShader(GL_TESS_CONTROL_SHADER);
		m_te_id = gl.createShader(GL_TESS_EVALUATION_SHADER);
	}

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateShader() call failed.");

	/* Execute all test iterations.. */
	for (int current_iteration = static_cast<int>(TEST_ITERATION_FIRST);
		 current_iteration < static_cast<int>(TEST_ITERATION_COUNT); current_iteration++)
	{
		glw::GLint	compile_status = GL_FALSE;
		std::string   current_iteration_body;
		const char*   current_iteration_body_raw_ptr = NULL;
		glu::ApiType  current_iteration_min_context_type;
		_shader_stage current_iteration_shader_stage;
		glw::GLuint   so_id = 0;

		getIterationData(static_cast<_test_iteration>(current_iteration), &current_iteration_min_context_type,
						 &current_iteration_shader_stage, &current_iteration_body);

		current_iteration_body_raw_ptr = current_iteration_body.c_str();

		/* Determine shader ID for the iteration. If the shader stage is not supported
		 * for the running context, skip it. */
		if (!glu::contextSupports(context_type, current_iteration_min_context_type))
		{
			continue;
		}

		switch (current_iteration_shader_stage)
		{
		case SHADER_STAGE_FRAGMENT:
			so_id = m_fs_id;
			break;
		case SHADER_STAGE_GEOMETRY:
			so_id = m_gs_id;
			break;
		case SHADER_STAGE_TESSELLATION_CONTROL:
			so_id = m_tc_id;
			break;
		case SHADER_STAGE_TESSELLATION_EVALUATION:
			so_id = m_te_id;
			break;
		case SHADER_STAGE_VERTEX:
			so_id = m_vs_id;
			break;

		default:
		{
			TCU_FAIL("Unrecognized shader stage type");
		}
		} /* switch (current_iteration_shader_stage) */

		DE_ASSERT(so_id != 0);

		/* Assign the source code to the SO */
		gl.shaderSource(so_id, 1,								   /* count */
						&current_iteration_body_raw_ptr, DE_NULL); /* length */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glShaderSource() call failed.");

		/* Try to compile the shader object. */
		gl.compileShader(so_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCompileShader() call failed.");

		gl.getShaderiv(so_id, GL_COMPILE_STATUS, &compile_status);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetShaderiv() call failed.");

		char temp[1024];

		gl.getShaderInfoLog(so_id, 1024, NULL, temp);

		if (compile_status == GL_TRUE)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "The following "
							   << getShaderStageName(current_iteration_shader_stage)
							   << " shader, used for test iteration ["
							   << getIterationName(static_cast<_test_iteration>(current_iteration))
							   << "] "
								  "was compiled successfully, even though it is invalid. Body:"
								  "\n>>\n"
							   << current_iteration_body << "\n<<\n"
							   << tcu::TestLog::EndMessage;

			result = false;
		}
	} /* for (all test iterations) */

	m_testCtx.setTestResult(result ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, result ? "Pass" : "Fail");

	return STOP;
}